

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uchar paethPredictor(short a,short b,short c)

{
  uchar uVar1;
  undefined2 in_register_00000012;
  undefined2 in_register_00000032;
  uint uVar2;
  undefined6 in_register_0000003a;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (uint)(ushort)b - (uint)(ushort)c;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  uVar2 = uVar2 & 0xffff;
  uVar4 = (uint)CONCAT62(in_register_0000003a,a);
  uVar5 = (uVar4 & 0xffff) - (uint)(ushort)c;
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar3 = uVar3 & 0xffff;
  uVar5 = CONCAT22(in_register_00000032,b) + uVar4 + CONCAT22(in_register_00000012,c) * -2;
  uVar4 = -uVar5;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar5 = uVar3;
  if (uVar2 <= uVar3) {
    uVar5 = uVar2;
  }
  uVar1 = (uchar)a;
  if (uVar2 > uVar3) {
    uVar1 = (uchar)b;
  }
  if ((uVar4 & 0xffff) < uVar5) {
    uVar1 = (uchar)c;
  }
  return uVar1;
}

Assistant:

static unsigned char paethPredictor(short a, short b, short c) {
  short pa = LODEPNG_ABS(b - c);
  short pb = LODEPNG_ABS(a - c);
  short pc = LODEPNG_ABS(a + b - c - c);
  /* return input value associated with smallest of pa, pb, pc (with certain priority if equal) */
  if(pb < pa) { a = b; pa = pb; }
  return (pc < pa) ? c : a;
}